

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

ggml_bf16_t f32_to_bf16(float x)

{
  ggml_bf16_t gVar1;
  float in_XMM0_Da;
  
  gVar1 = ggml_compute_fp32_to_bf16(in_XMM0_Da);
  return (ggml_bf16_t)gVar1.bits;
}

Assistant:

static inline ggml_bf16_t f32_to_bf16(float x) {
    return GGML_FP32_TO_BF16(x);
}